

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> __thiscall
enact::Parser::parsePrecUnary(Parser *this)

{
  bool bVar1;
  Parser *in_RSI;
  unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> local_118;
  undefined1 local_110 [8];
  unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> expr_1;
  optional<enact::Token> region;
  optional<enact::Token> permission;
  Token oper_1;
  undefined1 local_50 [8];
  unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> expr;
  Token oper;
  Parser *this_local;
  
  bVar1 = consume(in_RSI,MINUS);
  if ((((bVar1) || (bVar1 = consume(in_RSI,TILDE), bVar1)) || (bVar1 = consume(in_RSI,STAR), bVar1))
     || (bVar1 = consume(in_RSI,NOT), bVar1)) {
    Token::Token((Token *)&expr,&in_RSI->m_previous);
    parsePrecUnary((Parser *)local_50);
    std::
    make_unique<enact::UnaryExpr,std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>,enact::Token>
              ((unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)&oper_1.line,
               (Token *)local_50);
    std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>::
    unique_ptr<enact::UnaryExpr,std::default_delete<enact::UnaryExpr>,void>
              ((unique_ptr<enact::Expr,std::default_delete<enact::Expr>> *)this,
               (unique_ptr<enact::UnaryExpr,_std::default_delete<enact::UnaryExpr>_> *)&oper_1.line)
    ;
    std::unique_ptr<enact::UnaryExpr,_std::default_delete<enact::UnaryExpr>_>::~unique_ptr
              ((unique_ptr<enact::UnaryExpr,_std::default_delete<enact::UnaryExpr>_> *)&oper_1.line)
    ;
    std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>::~unique_ptr
              ((unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)local_50);
    Token::~Token((Token *)&expr);
  }
  else {
    bVar1 = consume(in_RSI,AMPERSAND);
    if (bVar1) {
      Token::Token((Token *)&permission.super__Optional_base<enact::Token,_false,_false>._M_payload.
                             super__Optional_payload<enact::Token,_true,_false,_false>.
                             super__Optional_payload_base<enact::Token>._M_engaged,
                   &in_RSI->m_previous);
      std::optional<enact::Token>::optional
                ((optional<enact::Token> *)
                 &region.super__Optional_base<enact::Token,_false,_false>._M_payload.
                  super__Optional_payload<enact::Token,_true,_false,_false>.
                  super__Optional_payload_base<enact::Token>._M_engaged);
      bVar1 = consume(in_RSI,MUT);
      if ((bVar1) || (bVar1 = consume(in_RSI,IMM), bVar1)) {
        std::optional<enact::Token>::operator=
                  ((optional<enact::Token> *)
                   &region.super__Optional_base<enact::Token,_false,_false>._M_payload.
                    super__Optional_payload<enact::Token,_true,_false,_false>.
                    super__Optional_payload_base<enact::Token>._M_engaged,&in_RSI->m_previous);
      }
      std::optional<enact::Token>::optional((optional<enact::Token> *)&expr_1);
      bVar1 = consume(in_RSI,SO);
      if (((bVar1) || (bVar1 = consume(in_RSI,RC), bVar1)) || (bVar1 = consume(in_RSI,GC), bVar1)) {
        std::optional<enact::Token>::operator=
                  ((optional<enact::Token> *)&expr_1,&in_RSI->m_previous);
      }
      parsePrecUnary((Parser *)local_110);
      std::
      make_unique<enact::ReferenceExpr,std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>,enact::Token,std::optional<enact::Token>,std::optional<enact::Token>>
                (&local_118,(Token *)local_110,
                 (optional<enact::Token> *)
                 &permission.super__Optional_base<enact::Token,_false,_false>._M_payload.
                  super__Optional_payload<enact::Token,_true,_false,_false>.
                  super__Optional_payload_base<enact::Token>._M_engaged,
                 (optional<enact::Token> *)
                 &region.super__Optional_base<enact::Token,_false,_false>._M_payload.
                  super__Optional_payload<enact::Token,_true,_false,_false>.
                  super__Optional_payload_base<enact::Token>._M_engaged);
      std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>::
      unique_ptr<enact::ReferenceExpr,std::default_delete<enact::ReferenceExpr>,void>
                ((unique_ptr<enact::Expr,std::default_delete<enact::Expr>> *)this,
                 (unique_ptr<enact::ReferenceExpr,_std::default_delete<enact::ReferenceExpr>_> *)
                 &local_118);
      std::unique_ptr<enact::ReferenceExpr,_std::default_delete<enact::ReferenceExpr>_>::~unique_ptr
                ((unique_ptr<enact::ReferenceExpr,_std::default_delete<enact::ReferenceExpr>_> *)
                 &local_118);
      std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>::~unique_ptr
                ((unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)local_110);
      std::optional<enact::Token>::~optional((optional<enact::Token> *)&expr_1);
      std::optional<enact::Token>::~optional
                ((optional<enact::Token> *)
                 &region.super__Optional_base<enact::Token,_false,_false>._M_payload.
                  super__Optional_payload<enact::Token,_true,_false,_false>.
                  super__Optional_payload_base<enact::Token>._M_engaged);
      Token::~Token((Token *)&permission.super__Optional_base<enact::Token,_false,_false>._M_payload
                              .super__Optional_payload<enact::Token,_true,_false,_false>.
                              super__Optional_payload_base<enact::Token>._M_engaged);
    }
    else {
      parsePrecCall(this);
    }
  }
  return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
         (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parsePrecUnary() {
        if (consume(TokenType::MINUS) ||
            consume(TokenType::TILDE) ||
            consume(TokenType::STAR) ||
            consume(TokenType::NOT)) {
            Token oper = m_previous;
            std::unique_ptr<Expr> expr = parsePrecUnary(); // Right recursion
            return std::make_unique<UnaryExpr>(std::move(expr), std::move(oper));
        }

        if (consume(TokenType::AMPERSAND)) {
            Token oper = m_previous;

            std::optional<Token> permission;
            if (consume(TokenType::MUT) || consume(TokenType::IMM)) {
                permission = m_previous;
            }

            std::optional<Token> region;
            if (consume(TokenType::SO) || consume(TokenType::RC) || consume(TokenType::GC)) {
                region = m_previous;
            }

            std::unique_ptr<Expr> expr = parsePrecUnary(); // Right recursion

            return std::make_unique<ReferenceExpr>(
                    std::move(expr),
                    std::move(oper),
                    std::move(permission),
                    std::move(region));
        }

        return parsePrecCall();
    }